

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::DebugInfoVisitor::visit(DebugInfoVisitor *this,SequentialStmtBlock *stmt)

{
  add_info(this,(Stmt *)stmt);
  return;
}

Assistant:

void inline visit(SequentialStmtBlock *stmt) override { add_info(stmt); }